

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O1

void secp256k1_scalar_to_signed62(secp256k1_modinv64_signed62 *r,secp256k1_scalar *a)

{
  int iVar1;
  secp256k1_modinv64_modinfo *psVar2;
  ulong uVar3;
  int64_t iVar4;
  int64_t iVar5;
  ulong uVar6;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  secp256k1_modinv64_signed62 *psVar10;
  ulong uVar11;
  secp256k1_modinv64_signed62 *psVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  ulong *extraout_RDX;
  long lVar16;
  long lVar17;
  secp256k1_modinv64_signed62 *a_00;
  long *extraout_RDX_00;
  long lVar18;
  long lVar19;
  secp256k1_modinv64_signed62 *b;
  int iVar20;
  undefined8 unaff_RBX;
  int64_t *piVar21;
  secp256k1_modinv64_signed62 *psVar22;
  secp256k1_modinv64_signed62 *psVar23;
  long lVar24;
  int64_t *unaff_RBP;
  secp256k1_modinv64_modinfo *psVar25;
  int64_t *a_01;
  ulong uVar26;
  int64_t *a_02;
  int64_t *piVar27;
  secp256k1_modinv64_modinfo *psVar28;
  ulong uVar29;
  long lVar30;
  int64_t *piVar31;
  long lVar32;
  int64_t *piVar33;
  int64_t *piVar34;
  long lVar35;
  long lVar36;
  secp256k1_modinv64_modinfo *psVar37;
  secp256k1_modinv64_modinfo *modinfo;
  long lVar38;
  int64_t *piVar39;
  long lVar40;
  int64_t *piVar41;
  bool bVar42;
  bool bVar43;
  secp256k1_modinv64_signed62 sStack_258;
  secp256k1_modinv64_signed62 sStack_230;
  secp256k1_modinv64_signed62 *psStack_208;
  int64_t *piStack_200;
  int64_t *piStack_1f8;
  ulong uStack_1f0;
  int64_t *piStack_1e8;
  ulong uStack_1e0;
  int64_t *piStack_1d8;
  secp256k1_modinv64_signed62 *psStack_1d0;
  long lStack_1c8;
  int64_t *piStack_1c0;
  int64_t *piStack_1b8;
  secp256k1_modinv64_signed62 *psStack_1b0;
  long lStack_1a8;
  secp256k1_modinv64_signed62 *psStack_1a0;
  secp256k1_modinv64_signed62 *psStack_198;
  secp256k1_modinv64_signed62 *psStack_190;
  secp256k1_modinv64_signed62 *psStack_188;
  long lStack_180;
  int64_t *piStack_178;
  int64_t *piStack_170;
  int64_t *piStack_168;
  secp256k1_modinv64_modinfo *psStack_160;
  int64_t *piStack_158;
  int64_t *piStack_150;
  long lStack_148;
  int64_t *piStack_140;
  int64_t *piStack_138;
  ulong uStack_130;
  uint uStack_124;
  secp256k1_modinv64_signed62 sStack_120;
  int64_t *piStack_f8;
  secp256k1_modinv64_modinfo *psStack_f0;
  int64_t *apiStack_e8 [2];
  ulong auStack_d8 [5];
  secp256k1_modinv64_trans2x2 sStack_b0;
  secp256k1_modinv64_signed62 sStack_90;
  secp256k1_modinv64_signed62 sStack_60;
  undefined8 uStack_38;
  
  uVar11 = a->d[1];
  uVar26 = a->d[2];
  uVar6 = a->d[3];
  bVar43 = uVar6 != 0xffffffffffffffff;
  bVar42 = 0xbaaedce6af48a03a < uVar11;
  psVar25 = (secp256k1_modinv64_modinfo *)a->d[0];
  if ((psVar25 < (secp256k1_modinv64_modinfo *)0xbfd25e8cd0364141 ||
      ((uVar26 < 0xfffffffffffffffe || bVar43) || !bVar42)) &&
      ((uVar11 < 0xbaaedce6af48a03c || ((uVar26 < 0xfffffffffffffffe || bVar43) || !bVar42)) &&
      (uVar26 != 0xffffffffffffffff || bVar43))) {
    r->v[0] = (ulong)psVar25 & 0x3fffffffffffffff;
    r->v[1] = (uVar11 & 0xfffffffffffffff) << 2 | (ulong)psVar25 >> 0x3e;
    r->v[2] = (uVar26 & 0x3ffffffffffffff) << 4 | uVar11 >> 0x3c;
    r->v[3] = (uVar6 & 0xffffffffffffff) << 6 | uVar26 >> 0x3a;
    r->v[4] = uVar6 >> 0x38;
    return;
  }
  secp256k1_scalar_to_signed62_cold_1();
  sStack_90.v[2] = 0;
  sStack_90.v[3] = 0;
  sStack_90.v[0] = 0;
  sStack_90.v[1] = 0;
  piVar41 = (int64_t *)0x0;
  sStack_90.v[4] = 0;
  sStack_60.v[1] = 0;
  sStack_60.v[4] = 0;
  sStack_60.v[2] = 0;
  sStack_60.v[3] = 0;
  sStack_60.v[0] = 1;
  sStack_120.v[4] = (psVar25->modulus).v[4];
  sStack_120.v[0] = (psVar25->modulus).v[0];
  sStack_120.v[1] = (psVar25->modulus).v[1];
  sStack_120.v[2] = (psVar25->modulus).v[2];
  sStack_120.v[3] = (psVar25->modulus).v[3];
  auStack_d8[3] = *(undefined8 *)((long)r + 0x20);
  apiStack_e8[1] = *(int64_t **)r;
  auStack_d8[0] = *(ulong *)((long)r + 8);
  auStack_d8[1] = *(undefined8 *)((long)r + 0x10);
  auStack_d8[2] = *(undefined8 *)((long)r + 0x18);
  lVar40 = -1;
  piVar21 = (int64_t *)0x5;
  piStack_f8 = r->v;
  psStack_f0 = psVar25;
  uStack_38 = CONCAT71((int7)((ulong)unaff_RBX >> 8),bVar42);
  do {
    modinfo = psStack_f0;
    piVar27 = (int64_t *)sStack_120.v[0];
    uStack_124 = (uint)piVar21;
    psVar2 = (secp256k1_modinv64_modinfo *)0x0;
    piVar31 = (int64_t *)0x0;
    psVar28 = (secp256k1_modinv64_modinfo *)0x1;
    uVar14 = 0x3e;
    a_01 = (int64_t *)0x1;
    piVar34 = apiStack_e8[1];
    piVar39 = (int64_t *)sStack_120.v[0];
    while( true ) {
      a_02 = (int64_t *)(-1L << ((byte)uVar14 & 0x3f) | (ulong)piVar34);
      psVar10 = (secp256k1_modinv64_signed62 *)0x0;
      if (a_02 != (int64_t *)0x0) {
        for (; ((ulong)a_02 >> (long)psVar10 & 1) == 0;
            psVar10 = (secp256k1_modinv64_signed62 *)((long)psVar10->v + 1)) {
        }
      }
      bVar7 = (byte)psVar10;
      piVar33 = (int64_t *)((ulong)piVar34 >> (bVar7 & 0x3f));
      a_01 = (int64_t *)((long)a_01 << (bVar7 & 0x3f));
      psVar2 = (secp256k1_modinv64_modinfo *)((long)psVar2 << (bVar7 & 0x3f));
      lVar40 = lVar40 - (long)psVar10;
      uVar14 = uVar14 - (int)psVar10;
      apiStack_e8[0] = piVar41;
      if (uVar14 == 0) break;
      if (((ulong)piVar39 & 1) == 0) {
        piStack_138 = (int64_t *)0x146910;
        secp256k1_modinv64_var_cold_8();
LAB_00146910:
        piStack_138 = (int64_t *)0x146915;
        secp256k1_modinv64_var_cold_7();
LAB_00146915:
        piStack_138 = (int64_t *)0x14691a;
        secp256k1_modinv64_var_cold_1();
LAB_0014691a:
        piStack_138 = (int64_t *)0x14691f;
        secp256k1_modinv64_var_cold_2();
LAB_0014691f:
        piStack_138 = (int64_t *)0x146924;
        secp256k1_modinv64_var_cold_6();
        piVar33 = piVar39;
        goto LAB_00146924;
      }
      if (((ulong)piVar33 & 1) == 0) goto LAB_00146910;
      a_02 = (int64_t *)((long)psVar2 * (long)apiStack_e8[1] + (long)a_01 * sStack_120.v[0]);
      psVar10 = (secp256k1_modinv64_signed62 *)(ulong)(0x3e - uVar14);
      bVar7 = (byte)(0x3e - uVar14);
      piVar21 = (int64_t *)((long)piVar39 << (bVar7 & 0x3f));
      if (a_02 != piVar21) goto LAB_00146915;
      piVar21 = (int64_t *)((long)psVar28 * (long)apiStack_e8[1] + (long)piVar31 * sStack_120.v[0]);
      a_02 = (int64_t *)((long)piVar33 << (bVar7 & 0x3f));
      if (piVar21 != a_02) goto LAB_0014691a;
      psVar10 = (secp256k1_modinv64_signed62 *)(lVar40 - 0x2ea);
      if (psVar10 < (secp256k1_modinv64_signed62 *)0xfffffffffffffa2d) goto LAB_0014691f;
      iVar1 = (int)piVar33;
      if (lVar40 < 0) {
        lVar40 = -lVar40;
        uVar8 = (int)lVar40 + 1;
        if ((int)uVar14 <= (int)uVar8) {
          uVar8 = uVar14;
        }
        psVar10 = (secp256k1_modinv64_signed62 *)(ulong)uVar8;
        a_02 = (int64_t *)(ulong)(uVar8 - 0x3f);
        if (0xffffffc1 < uVar8 - 0x3f) {
          psVar37 = (secp256k1_modinv64_modinfo *)-(long)psVar2;
          unaff_RBP = (int64_t *)-(long)a_01;
          piVar34 = (int64_t *)-(long)piVar39;
          piVar21 = (int64_t *)((ulong)(0x3fL << (-(char)uVar8 & 0x3fU)) >> (-(char)uVar8 & 0x3fU));
          uVar8 = (iVar1 * iVar1 + 0x3e) * iVar1 * (int)piVar34 & (uint)piVar21;
          psVar2 = psVar28;
          a_01 = piVar31;
          psVar25 = psVar37;
          goto LAB_001465cd;
        }
        goto LAB_0014692e;
      }
      uVar8 = (int)lVar40 + 1;
      if ((int)uVar14 <= (int)uVar8) {
        uVar8 = uVar14;
      }
      psVar10 = (secp256k1_modinv64_signed62 *)(ulong)uVar8;
      a_02 = (int64_t *)(ulong)(uVar8 - 0x3f);
      if (uVar8 - 0x3f < 0xffffffc2) goto LAB_00146929;
      piVar21 = (int64_t *)((ulong)(0xfL << (-(char)uVar8 & 0x3fU)) >> (-(char)uVar8 & 0x3fU));
      uVar8 = -(iVar1 * (((int)piVar39 * 2 + 2U & 8) + (int)piVar39)) & (uint)piVar21;
      unaff_RBP = piVar31;
      psVar37 = psVar28;
      piVar34 = piVar33;
      piVar33 = piVar39;
LAB_001465cd:
      uVar11 = (ulong)uVar8;
      a_02 = (int64_t *)(uVar11 * (long)piVar33);
      piVar34 = (int64_t *)((long)piVar34 + (long)a_02);
      piVar31 = (int64_t *)((long)a_01 * uVar11 + (long)unaff_RBP);
      psVar10 = (secp256k1_modinv64_signed62 *)(uVar11 * (long)psVar2);
      psVar28 = (secp256k1_modinv64_modinfo *)((long)psVar10->v + (long)&psVar37->modulus);
      piVar39 = piVar33;
      if (((ulong)piVar34 & (ulong)piVar21) != 0) {
LAB_00146924:
        piStack_138 = (int64_t *)0x146929;
        secp256k1_modinv64_var_cold_4();
        piVar39 = piVar33;
LAB_00146929:
        piStack_138 = (int64_t *)0x14692e;
        secp256k1_modinv64_var_cold_3();
LAB_0014692e:
        piStack_138 = (int64_t *)0x146933;
        secp256k1_modinv64_var_cold_5();
        goto LAB_00146933;
      }
    }
    a_02 = (int64_t *)((long)psVar2 * (long)piVar31);
    psVar10 = SUB168(SEXT816((long)psVar2) * SEXT816((long)piVar31),8);
    sStack_b0.u = (int64_t)a_01;
    sStack_b0.v = (int64_t)psVar2;
    sStack_b0.q = (int64_t)piVar31;
    sStack_b0.r = (int64_t)psVar28;
    if ((long)a_01 * (long)psVar28 - (long)a_02 != 0x4000000000000000 ||
        SUB168(SEXT816((long)a_01) * SEXT816((long)psVar28),8) - (long)psVar10 !=
        (ulong)((secp256k1_modinv64_signed62 *)((long)a_01 * (long)psVar28) < a_02)) {
LAB_00146933:
      piStack_138 = (int64_t *)0x146938;
      secp256k1_modinv64_var_cold_9();
      modinfo = psVar25;
LAB_00146938:
      piStack_138 = (int64_t *)0x14693d;
      secp256k1_modinv64_var_cold_20();
LAB_0014693d:
      piStack_138 = (int64_t *)0x146942;
      secp256k1_modinv64_var_cold_19();
LAB_00146942:
      piStack_138 = (int64_t *)0x146947;
      secp256k1_modinv64_var_cold_18();
      piVar41 = piVar27;
LAB_00146947:
      piStack_138 = (int64_t *)0x14694c;
      secp256k1_modinv64_var_cold_17();
LAB_0014694c:
      piStack_138 = (int64_t *)0x146951;
      secp256k1_modinv64_var_cold_14();
LAB_00146951:
      piStack_138 = (int64_t *)0x146956;
      secp256k1_modinv64_var_cold_13();
LAB_00146956:
      piStack_138 = (int64_t *)0x14695b;
      secp256k1_modinv64_var_cold_12();
LAB_0014695b:
      piStack_138 = (int64_t *)0x146960;
      secp256k1_modinv64_var_cold_11();
LAB_00146960:
      piStack_138 = (int64_t *)0x146965;
      secp256k1_modinv64_var_cold_10();
      goto LAB_00146965;
    }
    piStack_138 = (int64_t *)0x14665b;
    secp256k1_modinv64_update_de_62(&sStack_90,&sStack_60,&sStack_b0,psStack_f0);
    uVar14 = uStack_124;
    piVar39 = sStack_120.v;
    piVar21 = (int64_t *)(ulong)uStack_124;
    a_01 = (int64_t *)(ulong)uStack_124;
    psVar10 = (secp256k1_modinv64_signed62 *)0xffffffffffffffff;
    piStack_138 = (int64_t *)0x146678;
    a_02 = piVar39;
    iVar1 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)piVar39,uStack_124,&modinfo->modulus,-1);
    if (iVar1 < 1) goto LAB_00146938;
    psVar10 = (secp256k1_modinv64_signed62 *)0x1;
    a_01 = (int64_t *)(ulong)uVar14;
    piStack_138 = (int64_t *)0x146692;
    a_02 = piVar39;
    iVar1 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)piVar39,uVar14,&modinfo->modulus,1);
    if (0 < iVar1) goto LAB_0014693d;
    piVar27 = (int64_t *)(apiStack_e8 + 1);
    a_01 = (int64_t *)(ulong)uVar14;
    psVar10 = (secp256k1_modinv64_signed62 *)0xffffffffffffffff;
    piStack_138 = (int64_t *)0x1466b3;
    a_02 = piVar27;
    iVar1 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)piVar27,uVar14,&modinfo->modulus,-1);
    if (iVar1 < 1) goto LAB_00146942;
    psVar10 = (secp256k1_modinv64_signed62 *)0x1;
    a_01 = (int64_t *)(ulong)uVar14;
    piStack_138 = (int64_t *)0x1466cd;
    a_02 = piVar27;
    iVar1 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)piVar27,uVar14,&modinfo->modulus,1);
    piVar41 = piVar27;
    if (-1 < iVar1) goto LAB_00146947;
    piStack_138 = (int64_t *)0x1466ea;
    secp256k1_modinv64_update_fg_62_var
              (uVar14,(secp256k1_modinv64_signed62 *)piVar39,(secp256k1_modinv64_signed62 *)piVar27,
               &sStack_b0);
    piVar41 = apiStack_e8[0];
    if (apiStack_e8[1] != (int64_t *)0x0) {
LAB_001466fb:
      lVar13 = (long)(int)uVar14;
      uVar11 = *(ulong *)(&stack0xfffffffffffffed8 + lVar13 * 8);
      psVar10 = (secp256k1_modinv64_signed62 *)apiStack_e8[lVar13];
      a_02 = (int64_t *)((long)uVar11 >> 0x3f ^ uVar11 | lVar13 + -2 >> 0x3f);
      a_01 = (int64_t *)((long)psVar10 >> 0x3f ^ (ulong)psVar10 | (ulong)a_02);
      if (a_01 == (int64_t *)0x0) {
        piVar21 = (int64_t *)(ulong)(uVar14 - 1);
        (&uStack_130)[lVar13] = (&uStack_130)[lVar13] | uVar11 << 0x3e;
        psVar10 = (secp256k1_modinv64_signed62 *)((long)psVar10 << 0x3e);
        (&psStack_f0)[lVar13] =
             (secp256k1_modinv64_modinfo *)((ulong)(&psStack_f0)[lVar13] | (ulong)psVar10);
      }
      if (10 < (int)piVar41) goto LAB_0014694c;
      psVar10 = (secp256k1_modinv64_signed62 *)0xffffffffffffffff;
      piStack_138 = (int64_t *)0x14675d;
      iVar20 = (int)piVar21;
      a_01 = piVar21;
      a_02 = piVar39;
      iVar1 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)piVar39,iVar20,&modinfo->modulus,-1);
      if (iVar1 < 1) goto LAB_00146951;
      psVar10 = (secp256k1_modinv64_signed62 *)0x1;
      piStack_138 = (int64_t *)0x146777;
      a_01 = piVar21;
      a_02 = piVar39;
      iVar1 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)piVar39,iVar20,&modinfo->modulus,1);
      if (0 < iVar1) goto LAB_00146956;
      piVar39 = (int64_t *)(apiStack_e8 + 1);
      psVar10 = (secp256k1_modinv64_signed62 *)0xffffffffffffffff;
      piStack_138 = (int64_t *)0x146798;
      a_01 = piVar21;
      a_02 = piVar39;
      iVar1 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)piVar39,iVar20,&modinfo->modulus,-1);
      if (iVar1 < 1) goto LAB_0014695b;
      psVar10 = (secp256k1_modinv64_signed62 *)0x1;
      piStack_138 = (int64_t *)0x1467b2;
      a_01 = piVar21;
      a_02 = piVar39;
      iVar1 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)piVar39,iVar20,&modinfo->modulus,1);
      if (iVar1 < 0) {
        bVar42 = true;
        piVar41 = (int64_t *)(ulong)((int)piVar41 + 1);
        goto LAB_001467e7;
      }
      goto LAB_00146960;
    }
    if (1 < (int)uVar14) {
      uVar11 = 1;
      uVar26 = 0;
      do {
        uVar26 = uVar26 | auStack_d8[uVar11 - 1];
        uVar11 = uVar11 + 1;
      } while (uVar14 != uVar11);
      if (uVar26 != 0) goto LAB_001466fb;
    }
    bVar42 = false;
LAB_001467e7:
    psVar25 = modinfo;
  } while (bVar42);
  a_02 = (int64_t *)(apiStack_e8 + 1);
  iVar20 = (int)piVar21;
  psVar10 = (secp256k1_modinv64_signed62 *)0x0;
  piStack_138 = (int64_t *)0x146804;
  a_01 = piVar21;
  iVar1 = secp256k1_modinv64_mul_cmp_62
                    ((secp256k1_modinv64_signed62 *)a_02,iVar20,&SECP256K1_SIGNED62_ONE,0);
  if (iVar1 == 0) {
    piStack_138 = (int64_t *)0x146826;
    iVar1 = secp256k1_modinv64_mul_cmp_62(&sStack_120,iVar20,&SECP256K1_SIGNED62_ONE,-1);
    piVar41 = piStack_f8;
    if (iVar1 == 0) {
LAB_001468c6:
      piStack_138 = (int64_t *)0x1468e1;
      secp256k1_modinv64_normalize_62
                (&sStack_90,*(int64_t *)(&stack0xfffffffffffffed8 + (long)iVar20 * 8),modinfo);
      piVar41[4] = sStack_90.v[4];
      piVar41[2] = sStack_90.v[2];
      piVar41[3] = sStack_90.v[3];
      *piVar41 = sStack_90.v[0];
      piVar41[1] = sStack_90.v[1];
      return;
    }
    piStack_138 = (int64_t *)0x14684b;
    iVar1 = secp256k1_modinv64_mul_cmp_62(&sStack_120,iVar20,&SECP256K1_SIGNED62_ONE,1);
    if (iVar1 == 0) goto LAB_001468c6;
    a_01 = (int64_t *)0x5;
    psVar10 = (secp256k1_modinv64_signed62 *)0x0;
    piStack_138 = (int64_t *)0x146865;
    a_02 = piVar41;
    iVar1 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)piVar41,5,&SECP256K1_SIGNED62_ONE,0);
    if (iVar1 == 0) {
      a_02 = sStack_90.v;
      a_01 = (int64_t *)0x5;
      psVar10 = (secp256k1_modinv64_signed62 *)0x0;
      piStack_138 = (int64_t *)0x146888;
      iVar1 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)a_02,5,&SECP256K1_SIGNED62_ONE,0);
      if (iVar1 == 0) {
        piStack_138 = (int64_t *)0x1468a4;
        iVar1 = secp256k1_modinv64_mul_cmp_62(&sStack_120,iVar20,&modinfo->modulus,1);
        if (iVar1 == 0) goto LAB_001468c6;
        a_02 = sStack_120.v;
        psVar10 = (secp256k1_modinv64_signed62 *)0xffffffffffffffff;
        piStack_138 = (int64_t *)0x1468be;
        a_01 = piVar21;
        iVar1 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)a_02,iVar20,&modinfo->modulus,-1);
        if (iVar1 == 0) goto LAB_001468c6;
      }
    }
  }
  else {
LAB_00146965:
    piStack_138 = (int64_t *)0x14696a;
    secp256k1_modinv64_var_cold_15();
  }
  piStack_138 = (int64_t *)secp256k1_scalar_from_signed62;
  secp256k1_modinv64_var_cold_16();
  piStack_138 = piVar21;
  if ((ulong)*a_01 >> 0x3e == 0) {
    uVar11 = a_01[1];
    if (0x3fffffffffffffff < uVar11) goto LAB_00146a68;
    uVar26 = a_01[2];
    if (0x3fffffffffffffff < uVar26) goto LAB_00146a6d;
    uVar6 = a_01[3];
    if (0x3fffffffffffffff < uVar6) goto LAB_00146a72;
    psVar10 = (secp256k1_modinv64_signed62 *)a_01[4];
    if ((secp256k1_modinv64_signed62 *)0xff < psVar10) goto LAB_00146a77;
    uVar3 = uVar11 << 0x3e | *a_01;
    uVar15 = uVar26 << 0x3c | uVar11 >> 2;
    uVar26 = uVar6 << 0x3a | uVar26 >> 4;
    uVar11 = (long)psVar10 << 0x38 | uVar6 >> 6;
    *a_02 = uVar3;
    a_02[1] = uVar15;
    a_02[2] = uVar26;
    a_02[3] = uVar11;
    uVar14 = (uint)((0xfffffffffffffffd < uVar26 && uVar11 == 0xffffffffffffffff) &&
                   0xbaaedce6af48a03a < uVar15);
    uVar8 = 0;
    if (0xbaaedce6af48a03b < uVar15) {
      uVar8 = uVar14;
    }
    uVar8 = uVar8 | (uVar26 == 0xffffffffffffffff && uVar11 == 0xffffffffffffffff);
    a_01 = (int64_t *)(ulong)uVar8;
    a_02 = (int64_t *)0xbfd25e8cd0364140;
    uVar9 = 0;
    if (0xbfd25e8cd0364140 < uVar3) {
      uVar9 = uVar14;
    }
    uVar9 = uVar9 | uVar8;
    psVar10 = (secp256k1_modinv64_signed62 *)(ulong)uVar9;
    piVar21 = (int64_t *)CONCAT71((int7)((ulong)piVar21 >> 8),0xbaaedce6af48a03a < uVar15);
    if (uVar9 == 0) {
      return;
    }
  }
  else {
    piStack_140 = (int64_t *)0x146a68;
    secp256k1_scalar_from_signed62_cold_6();
LAB_00146a68:
    piStack_140 = (int64_t *)0x146a6d;
    secp256k1_scalar_from_signed62_cold_5();
LAB_00146a6d:
    piStack_140 = (int64_t *)0x146a72;
    secp256k1_scalar_from_signed62_cold_4();
LAB_00146a72:
    piStack_140 = (int64_t *)0x146a77;
    secp256k1_scalar_from_signed62_cold_3();
LAB_00146a77:
    piStack_140 = (int64_t *)0x146a7c;
    secp256k1_scalar_from_signed62_cold_2();
  }
  piStack_140 = (int64_t *)secp256k1_modinv64_update_de_62;
  secp256k1_scalar_from_signed62_cold_1();
  piStack_140 = unaff_RBP;
  lStack_148 = lVar40;
  piStack_150 = piVar41;
  piStack_158 = piVar39;
  psStack_160 = modinfo;
  piStack_168 = piVar21;
  lVar40 = *a_02;
  piStack_178 = (int64_t *)a_02[1];
  psStack_188 = (secp256k1_modinv64_signed62 *)a_02[2];
  lStack_1a8 = a_02[3];
  psStack_198 = (secp256k1_modinv64_signed62 *)a_02[4];
  piVar41 = (int64_t *)*a_01;
  piStack_170 = (int64_t *)a_01[1];
  lStack_180 = a_01[2];
  uStack_1e0 = *extraout_RDX;
  piStack_1d8 = (int64_t *)extraout_RDX[1];
  uStack_1f0 = extraout_RDX[2];
  piStack_1e8 = (int64_t *)extraout_RDX[3];
  psVar22 = (secp256k1_modinv64_signed62 *)a_01[3];
  psStack_1a0 = (secp256k1_modinv64_signed62 *)a_01[4];
  piVar21 = (int64_t *)0x5;
  psVar12 = (secp256k1_modinv64_signed62 *)0xfffffffffffffffe;
  piStack_1f8 = (int64_t *)0x146b1d;
  piVar27 = a_02;
  iVar1 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)a_02,5,psVar10,-2);
  if (iVar1 < 1) {
    piStack_1f8 = (int64_t *)0x14763d;
    secp256k1_modinv64_update_de_62_cold_34();
LAB_0014763d:
    piStack_1f8 = (int64_t *)0x147642;
    secp256k1_modinv64_update_de_62_cold_33();
LAB_00147642:
    piStack_1f8 = (int64_t *)0x147647;
    secp256k1_modinv64_update_de_62_cold_32();
LAB_00147647:
    piStack_1f8 = (int64_t *)0x14764c;
    secp256k1_modinv64_update_de_62_cold_31();
LAB_0014764c:
    piStack_1f8 = (int64_t *)0x147651;
    secp256k1_modinv64_update_de_62_cold_30();
LAB_00147651:
    piStack_1f8 = (int64_t *)0x147656;
    secp256k1_modinv64_update_de_62_cold_29();
LAB_00147656:
    piStack_1f8 = (int64_t *)0x14765b;
    secp256k1_modinv64_update_de_62_cold_1();
LAB_0014765b:
    piStack_1f8 = (int64_t *)0x147660;
    secp256k1_modinv64_update_de_62_cold_2();
    psVar22 = psVar10;
LAB_00147660:
    piStack_1f8 = (int64_t *)0x147665;
    secp256k1_modinv64_update_de_62_cold_3();
LAB_00147665:
    piStack_1f8 = (int64_t *)0x14766a;
    secp256k1_modinv64_update_de_62_cold_4();
LAB_0014766a:
    piStack_1f8 = (int64_t *)0x14766f;
    secp256k1_modinv64_update_de_62_cold_5();
    psVar23 = psVar22;
LAB_0014766f:
    piStack_1f8 = (int64_t *)0x147674;
    secp256k1_modinv64_update_de_62_cold_6();
LAB_00147674:
    piStack_1f8 = (int64_t *)0x147679;
    secp256k1_modinv64_update_de_62_cold_7();
LAB_00147679:
    piStack_1f8 = (int64_t *)0x14767e;
    secp256k1_modinv64_update_de_62_cold_8();
LAB_0014767e:
    piStack_1f8 = (int64_t *)0x147683;
    secp256k1_modinv64_update_de_62_cold_11();
LAB_00147683:
    piStack_1f8 = (int64_t *)0x147688;
    secp256k1_modinv64_update_de_62_cold_12();
LAB_00147688:
    piStack_1f8 = (int64_t *)0x14768d;
    secp256k1_modinv64_update_de_62_cold_15();
LAB_0014768d:
    piStack_1f8 = (int64_t *)0x147692;
    secp256k1_modinv64_update_de_62_cold_16();
LAB_00147692:
    piStack_1f8 = (int64_t *)0x147697;
    secp256k1_modinv64_update_de_62_cold_19();
LAB_00147697:
    piStack_1f8 = (int64_t *)0x14769c;
    secp256k1_modinv64_update_de_62_cold_20();
LAB_0014769c:
    piStack_1f8 = (int64_t *)0x1476a1;
    secp256k1_modinv64_update_de_62_cold_21();
LAB_001476a1:
    piVar39 = piVar41;
    a_01 = a_02;
    piStack_1f8 = (int64_t *)0x1476a6;
    secp256k1_modinv64_update_de_62_cold_22();
LAB_001476a6:
    piStack_1f8 = (int64_t *)0x1476ab;
    secp256k1_modinv64_update_de_62_cold_28();
LAB_001476ab:
    piStack_1f8 = (int64_t *)0x1476b0;
    secp256k1_modinv64_update_de_62_cold_27();
LAB_001476b0:
    piStack_1f8 = (int64_t *)0x1476b5;
    secp256k1_modinv64_update_de_62_cold_26();
LAB_001476b5:
    piStack_1f8 = (int64_t *)0x1476ba;
    secp256k1_modinv64_update_de_62_cold_25();
LAB_001476ba:
    piStack_1f8 = (int64_t *)0x1476bf;
    secp256k1_modinv64_update_de_62_cold_24();
LAB_001476bf:
    piStack_1f8 = (int64_t *)0x1476c4;
    secp256k1_modinv64_update_de_62_cold_23();
    a_02 = a_01;
    piVar34 = piVar39;
LAB_001476c4:
    piStack_1f8 = (int64_t *)0x1476c9;
    secp256k1_modinv64_update_de_62_cold_9();
LAB_001476c9:
    piStack_1f8 = (int64_t *)0x1476ce;
    secp256k1_modinv64_update_de_62_cold_10();
LAB_001476ce:
    piStack_1f8 = (int64_t *)0x1476d3;
    secp256k1_modinv64_update_de_62_cold_13();
LAB_001476d3:
    psVar22 = psVar12;
    piStack_1f8 = (int64_t *)0x1476d8;
    secp256k1_modinv64_update_de_62_cold_14();
LAB_001476d8:
    uVar14 = (uint)piVar21;
    piStack_1f8 = (int64_t *)0x1476dd;
    secp256k1_modinv64_update_de_62_cold_17();
  }
  else {
    psVar12 = (secp256k1_modinv64_signed62 *)0x1;
    piVar21 = (int64_t *)0x5;
    piStack_1f8 = (int64_t *)0x146b3a;
    piVar27 = a_02;
    iVar1 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)a_02,5,psVar10,1);
    if (-1 < iVar1) goto LAB_0014763d;
    piVar21 = (int64_t *)0x5;
    psVar12 = (secp256k1_modinv64_signed62 *)0xfffffffffffffffe;
    piStack_1f8 = (int64_t *)0x146b59;
    piVar27 = a_01;
    iVar1 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)a_01,5,psVar10,-2);
    if (iVar1 < 1) goto LAB_00147642;
    psVar12 = (secp256k1_modinv64_signed62 *)0x1;
    piVar21 = (int64_t *)0x5;
    piStack_1f8 = (int64_t *)0x146b76;
    piVar27 = a_01;
    iVar1 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)a_01,5,psVar10,1);
    if (-1 < iVar1) goto LAB_00147647;
    piStack_1f8 = (int64_t *)0x146b9c;
    piStack_1b8 = a_02;
    psStack_190 = psVar22;
    iVar4 = secp256k1_modinv64_abs(uStack_1e0);
    piStack_1f8 = (int64_t *)0x146ba9;
    piVar27 = piStack_1d8;
    iVar5 = secp256k1_modinv64_abs((int64_t)piStack_1d8);
    psVar12 = (secp256k1_modinv64_signed62 *)(0x4000000000000000 - iVar5);
    a_02 = (int64_t *)0x3fffffffffffffff;
    if ((long)psVar12 < iVar4) goto LAB_0014764c;
    piStack_1f8 = (int64_t *)0x146bc4;
    iVar4 = secp256k1_modinv64_abs(uStack_1f0);
    piStack_1f8 = (int64_t *)0x146bd1;
    piVar27 = piStack_1e8;
    iVar5 = secp256k1_modinv64_abs((int64_t)piStack_1e8);
    piVar39 = piStack_1b8;
    psVar12 = (secp256k1_modinv64_signed62 *)(0x4000000000000000 - iVar5);
    if ((long)psVar12 < iVar4) goto LAB_00147651;
    a_02 = (int64_t *)0x7fffffffffffffff;
    piVar21 = (int64_t *)(uStack_1e0 * lVar40);
    psVar12 = SUB168(SEXT816((long)uStack_1e0) * SEXT816(lVar40),8);
    uVar11 = (long)piStack_1d8 * (long)piVar41;
    lVar16 = SUB168(SEXT816((long)piStack_1d8) * SEXT816((long)piVar41),8);
    lVar13 = (0x7fffffffffffffff - lVar16) - (long)psVar12;
    if (-1 < lVar16 &&
        (SBORROW8(0x7fffffffffffffff - lVar16,(long)psVar12) !=
        SBORROW8(lVar13,(ulong)((undefined1 *)~uVar11 < piVar21))) !=
        (long)(lVar13 - (ulong)((undefined1 *)~uVar11 < piVar21)) < 0) goto LAB_00147656;
    piVar34 = (int64_t *)(uVar11 + (long)piVar21);
    lVar32 = (long)psVar12->v + (ulong)CARRY8(uVar11,(ulong)piVar21) + lVar16;
    uVar26 = uStack_1f0 * lVar40;
    lVar16 = SUB168(SEXT816((long)uStack_1f0) * SEXT816(lVar40),8);
    uVar6 = (long)piStack_1e8 * (long)piVar41;
    lVar17 = SUB168(SEXT816((long)piStack_1e8) * SEXT816((long)piVar41),8);
    uVar11 = (ulong)(-uVar6 - 1 < uVar26);
    lVar40 = (0x7fffffffffffffff - lVar17) - lVar16;
    lVar13 = lVar40 - uVar11;
    bVar42 = (SBORROW8(0x7fffffffffffffff - lVar17,lVar16) != SBORROW8(lVar40,uVar11)) == lVar13 < 0
    ;
    psVar12 = (secp256k1_modinv64_signed62 *)
              CONCAT71((int7)((ulong)lVar13 >> 8),lVar17 < 0 || bVar42);
    if (lVar17 >= 0 && !bVar42) goto LAB_0014765b;
    psVar22 = (secp256k1_modinv64_signed62 *)((long)psStack_1a0 >> 0x3f);
    lStack_1c8 = ((ulong)piStack_1d8 & (ulong)psVar22) + (uStack_1e0 & (long)psStack_198 >> 0x3f);
    uVar3 = uVar6 + uVar26;
    piVar27 = (int64_t *)(lVar17 + lVar16 + (ulong)CARRY8(uVar6,uVar26));
    lVar40 = psVar10->v[0];
    piVar21 = (int64_t *)psVar10[1].v[0];
    psVar12 = (secp256k1_modinv64_signed62 *)0x3fffffffffffffff;
    lStack_1c8 = lStack_1c8 - ((long)piVar21 * (long)piVar34 + lStack_1c8 & 0x3fffffffffffffffU);
    uVar26 = lStack_1c8 * lVar40;
    lVar16 = SUB168(SEXT816(lStack_1c8) * SEXT816(lVar40),8);
    uVar11 = (ulong)((undefined1 *)(-uVar26 - 1) < piVar34);
    lVar13 = (0x7fffffffffffffff - lVar16) - lVar32;
    piVar41 = (int64_t *)((-0x8000000000000000 - lVar16) - (ulong)(uVar26 != 0));
    bVar42 = (SBORROW8(0x7fffffffffffffff - lVar16,lVar32) != SBORROW8(lVar13,uVar11)) ==
             (long)(lVar13 - uVar11) < 0;
    if (lVar16 < 0) {
      bVar42 = (SBORROW8(lVar32,(long)piVar41) !=
               SBORROW8(lVar32 - (long)piVar41,(ulong)(piVar34 < (undefined1 *)-uVar26))) ==
               (long)((lVar32 - (long)piVar41) - (ulong)(piVar34 < (undefined1 *)-uVar26)) < 0;
    }
    piStack_1c0 = a_01;
    psStack_1b0 = psVar10;
    if (!bVar42) goto LAB_00147660;
    lVar13 = ((ulong)psVar22 & (ulong)piStack_1e8) + ((long)psStack_198 >> 0x3f & uStack_1f0);
    psVar22 = (secp256k1_modinv64_signed62 *)
              (lVar13 - ((long)piVar21 * uVar3 + lVar13 & 0x3fffffffffffffff));
    lVar16 = lVar16 + lVar32 + (ulong)CARRY8(uVar26,(ulong)piVar34);
    uVar6 = (long)psVar22 * lVar40;
    lVar13 = SUB168(SEXT816((long)psVar22) * SEXT816(lVar40),8);
    uVar11 = (ulong)(-uVar6 - 1 < uVar3);
    lVar40 = (0x7fffffffffffffff - lVar13) - (long)piVar27;
    piVar21 = (int64_t *)((-0x8000000000000000 - lVar13) - (ulong)(uVar6 != 0));
    bVar42 = (SBORROW8(0x7fffffffffffffff - lVar13,(long)piVar27) != SBORROW8(lVar40,uVar11)) ==
             (long)(lVar40 - uVar11) < 0;
    if (lVar13 < 0) {
      bVar42 = (SBORROW8((long)piVar27,(long)piVar21) !=
               SBORROW8((long)piVar27 - (long)piVar21,(ulong)(uVar3 < -uVar6))) ==
               (long)(((long)piVar27 - (long)piVar21) - (ulong)(uVar3 < -uVar6)) < 0;
    }
    if (!bVar42) goto LAB_00147665;
    lVar40 = (long)piVar27 + (ulong)CARRY8(uVar6,uVar3) + lVar13;
    if ((uVar26 + (long)piVar34 & 0x3fffffffffffffff) != 0) goto LAB_0014766a;
    psVar23 = psVar22;
    if ((uVar6 + uVar3 & 0x3fffffffffffffff) != 0) goto LAB_0014766f;
    psVar23 = (secp256k1_modinv64_signed62 *)0x8000000000000000;
    uVar11 = (ulong)(uVar26 + (long)piVar34) >> 0x3e | lVar16 * 4;
    psVar12 = (secp256k1_modinv64_signed62 *)0x7fffffffffffffff;
    uVar15 = uStack_1e0 * (long)piStack_178 + uVar11;
    piVar27 = (int64_t *)
              (SUB168(SEXT816((long)uStack_1e0) * SEXT816((long)piStack_178),8) + (lVar16 >> 0x3e) +
              (ulong)CARRY8(uStack_1e0 * (long)piStack_178,uVar11));
    uVar26 = (long)piStack_1d8 * (long)piStack_170;
    lVar17 = SUB168(SEXT816((long)piStack_1d8) * SEXT816((long)piStack_170),8);
    uVar11 = (ulong)(-uVar26 - 1 < uVar15);
    lVar13 = (0x7fffffffffffffff - lVar17) - (long)piVar27;
    lVar32 = (-0x8000000000000000 - lVar17) - (ulong)(uVar26 != 0);
    lVar16 = (long)piVar27 - lVar32;
    bVar42 = (SBORROW8(0x7fffffffffffffff - lVar17,(long)piVar27) != SBORROW8(lVar13,uVar11)) ==
             (long)(lVar13 - uVar11) < 0;
    if (lVar17 < 0) {
      bVar42 = (SBORROW8((long)piVar27,lVar32) != SBORROW8(lVar16,(ulong)(uVar15 < -uVar26))) ==
               (long)(lVar16 - (ulong)(uVar15 < -uVar26)) < 0;
    }
    piVar21 = (int64_t *)(ulong)bVar42;
    a_02 = piStack_178;
    piVar41 = piStack_170;
    psStack_1d0 = psVar22;
    if (bVar42 == false) goto LAB_00147674;
    uVar11 = uVar6 + uVar3 >> 0x3e | lVar40 * 4;
    uVar6 = uVar15 + uVar26;
    piVar27 = (int64_t *)((long)piVar27 + (ulong)CARRY8(uVar15,uVar26) + lVar17);
    uVar3 = uStack_1f0 * (long)piStack_178 + uVar11;
    lVar17 = SUB168(SEXT816((long)uStack_1f0) * SEXT816((long)piStack_178),8) + (lVar40 >> 0x3e) +
             (ulong)CARRY8(uStack_1f0 * (long)piStack_178,uVar11);
    uVar26 = (long)piStack_1e8 * (long)piStack_170;
    lVar16 = SUB168(SEXT816((long)piStack_1e8) * SEXT816((long)piStack_170),8);
    uVar11 = (ulong)(-uVar26 - 1 < uVar3);
    lVar40 = (0x7fffffffffffffff - lVar16) - lVar17;
    lVar32 = (-0x8000000000000000 - lVar16) - (ulong)(uVar26 != 0);
    lVar13 = lVar17 - lVar32;
    bVar42 = (SBORROW8(0x7fffffffffffffff - lVar16,lVar17) != SBORROW8(lVar40,uVar11)) ==
             (long)(lVar40 - uVar11) < 0;
    if (lVar16 < 0) {
      bVar42 = (SBORROW8(lVar17,lVar32) != SBORROW8(lVar13,(ulong)(uVar3 < -uVar26))) ==
               (long)(lVar13 - (ulong)(uVar3 < -uVar26)) < 0;
    }
    piVar21 = (int64_t *)(ulong)bVar42;
    if (bVar42 == false) goto LAB_00147679;
    a_02 = (int64_t *)0x7fffffffffffffff;
    uVar11 = uVar3 + uVar26;
    lVar13 = lVar17 + lVar16 + (ulong)CARRY8(uVar3,uVar26);
    lVar40 = psVar10->v[1];
    if (lVar40 != 0) {
      uVar3 = lVar40 * lStack_1c8;
      lVar17 = SUB168(SEXT816(lVar40) * SEXT816(lStack_1c8),8);
      uVar26 = (ulong)(-uVar3 - 1 < uVar6);
      lVar16 = (0x7fffffffffffffff - lVar17) - (long)piVar27;
      piVar21 = (int64_t *)((-0x8000000000000000 - lVar17) - (ulong)(uVar3 != 0));
      bVar42 = (SBORROW8(0x7fffffffffffffff - lVar17,(long)piVar27) != SBORROW8(lVar16,uVar26)) ==
               (long)(lVar16 - uVar26) < 0;
      if (lVar17 < 0) {
        bVar42 = (SBORROW8((long)piVar27,(long)piVar21) !=
                 SBORROW8((long)piVar27 - (long)piVar21,(ulong)(uVar6 < -uVar3))) ==
                 (long)(((long)piVar27 - (long)piVar21) - (ulong)(uVar6 < -uVar3)) < 0;
      }
      psVar12 = psVar22;
      piVar34 = piStack_170;
      if (!bVar42) goto LAB_001476c4;
      uVar15 = lVar40 * (long)psVar22;
      lVar32 = SUB168(SEXT816(lVar40) * SEXT816((long)psVar22),8);
      uVar26 = (ulong)(-uVar15 - 1 < uVar11);
      lVar40 = (0x7fffffffffffffff - lVar32) - lVar13;
      lVar38 = (-0x8000000000000000 - lVar32) - (ulong)(uVar15 != 0);
      lVar16 = lVar13 - lVar38;
      piVar34 = (int64_t *)(lVar16 - (ulong)(uVar11 < -uVar15));
      bVar42 = (SBORROW8(0x7fffffffffffffff - lVar32,lVar13) != SBORROW8(lVar40,uVar26)) ==
               (long)(lVar40 - uVar26) < 0;
      if (lVar32 < 0) {
        bVar42 = (SBORROW8(lVar13,lVar38) != SBORROW8(lVar16,(ulong)(uVar11 < -uVar15))) ==
                 (long)piVar34 < 0;
      }
      piVar21 = (int64_t *)(ulong)bVar42;
      if (bVar42 != false) {
        bVar42 = CARRY8(uVar6,uVar3);
        uVar6 = uVar6 + uVar3;
        piVar27 = (int64_t *)((long)piVar27 + (ulong)bVar42 + lVar17);
        bVar42 = CARRY8(uVar11,uVar15);
        uVar11 = uVar11 + uVar15;
        lVar13 = lVar13 + lVar32 + (ulong)bVar42;
        goto LAB_00146f98;
      }
      goto LAB_001476c9;
    }
LAB_00146f98:
    uVar26 = (long)piVar27 << 2 | uVar6 >> 0x3e;
    uVar15 = uStack_1e0 * (long)psStack_188 + uVar26;
    piVar27 = (int64_t *)
              (((long)piVar27 >> 0x3e) +
               SUB168(SEXT816((long)uStack_1e0) * SEXT816((long)psStack_188),8) +
              (ulong)CARRY8(uStack_1e0 * (long)psStack_188,uVar26));
    uVar3 = (long)piStack_1d8 * lStack_180;
    lVar17 = SUB168(SEXT816((long)piStack_1d8) * SEXT816(lStack_180),8);
    uVar26 = (ulong)(-uVar3 - 1 < uVar15);
    lVar40 = (0x7fffffffffffffff - lVar17) - (long)piVar27;
    lVar32 = (-0x8000000000000000 - lVar17) - (ulong)(uVar3 != 0);
    lVar16 = (long)piVar27 - lVar32;
    *piStack_1b8 = uVar6 & 0x3fffffffffffffff;
    *a_01 = uVar11 & 0x3fffffffffffffff;
    bVar42 = (SBORROW8((long)piVar27,lVar32) != SBORROW8(lVar16,(ulong)(uVar15 < -uVar3))) ==
             (long)(lVar16 - (ulong)(uVar15 < -uVar3)) < 0;
    piVar21 = (int64_t *)(ulong)bVar42;
    bVar43 = (SBORROW8(0x7fffffffffffffff - lVar17,(long)piVar27) != SBORROW8(lVar40,uVar26)) ==
             (long)(lVar40 - uVar26) < 0;
    if (lVar17 < 0) {
      bVar43 = bVar42;
    }
    psVar12 = psStack_188;
    piVar41 = piStack_1b8;
    if (!bVar43) goto LAB_0014767e;
    uVar11 = uVar11 >> 0x3e | lVar13 << 2;
    uVar29 = uVar15 + uVar3;
    piVar27 = (int64_t *)((long)piVar27 + (ulong)CARRY8(uVar15,uVar3) + lVar17);
    uVar6 = uStack_1f0 * (long)psStack_188 + uVar11;
    lVar16 = SUB168(SEXT816((long)uStack_1f0) * SEXT816((long)psStack_188),8) + (lVar13 >> 0x3e) +
             (ulong)CARRY8(uStack_1f0 * (long)psStack_188,uVar11);
    uVar26 = (long)piStack_1e8 * lStack_180;
    lVar13 = SUB168(SEXT816((long)piStack_1e8) * SEXT816(lStack_180),8);
    uVar11 = (ulong)(-uVar26 - 1 < uVar6);
    lVar40 = (0x7fffffffffffffff - lVar13) - lVar16;
    psVar12 = (secp256k1_modinv64_signed62 *)0x8000000000000000;
    psVar23 = (secp256k1_modinv64_signed62 *)((-0x8000000000000000 - lVar13) - (ulong)(uVar26 != 0))
    ;
    bVar42 = (SBORROW8(0x7fffffffffffffff - lVar13,lVar16) != SBORROW8(lVar40,uVar11)) ==
             (long)(lVar40 - uVar11) < 0;
    if (lVar13 < 0) {
      bVar42 = (SBORROW8(lVar16,(long)psVar23) !=
               SBORROW8(lVar16 - (long)psVar23,(ulong)(uVar6 < -uVar26))) ==
               (long)((lVar16 - (long)psVar23) - (ulong)(uVar6 < -uVar26)) < 0;
    }
    piVar21 = (int64_t *)(ulong)bVar42;
    if (bVar42 == false) goto LAB_00147683;
    uVar11 = uVar6 + uVar26;
    lVar13 = lVar16 + lVar13 + (ulong)CARRY8(uVar6,uVar26);
    lVar40 = psVar10->v[2];
    if (lVar40 != 0) {
      uVar6 = lVar40 * lStack_1c8;
      lVar17 = SUB168(SEXT816(lVar40) * SEXT816(lStack_1c8),8);
      uVar26 = (ulong)(-uVar6 - 1 < uVar29);
      lVar16 = (0x7fffffffffffffff - lVar17) - (long)piVar27;
      piVar21 = (int64_t *)((-0x8000000000000000 - lVar17) - (ulong)(uVar6 != 0));
      bVar42 = (SBORROW8(0x7fffffffffffffff - lVar17,(long)piVar27) != SBORROW8(lVar16,uVar26)) ==
               (long)(lVar16 - uVar26) < 0;
      if (lVar17 < 0) {
        bVar42 = (SBORROW8((long)piVar27,(long)piVar21) !=
                 SBORROW8((long)piVar27 - (long)piVar21,(ulong)(uVar29 < -uVar6))) ==
                 (long)(((long)piVar27 - (long)piVar21) - (ulong)(uVar29 < -uVar6)) < 0;
      }
      piVar34 = piStack_1b8;
      if (!bVar42) goto LAB_001476ce;
      uVar3 = lVar40 * (long)psVar22;
      lVar32 = SUB168(SEXT816(lVar40) * SEXT816((long)psVar22),8);
      uVar26 = (ulong)(-uVar3 - 1 < uVar11);
      lVar40 = (0x7fffffffffffffff - lVar32) - lVar13;
      lVar38 = (-0x8000000000000000 - lVar32) - (ulong)(uVar3 != 0);
      lVar16 = lVar13 - lVar38;
      piVar34 = (int64_t *)
                (ulong)((SBORROW8(lVar13,lVar38) != SBORROW8(lVar16,(ulong)(uVar11 < -uVar3))) ==
                       (long)(lVar16 - (ulong)(uVar11 < -uVar3)) < 0);
      piVar21 = (int64_t *)
                (ulong)((SBORROW8(0x7fffffffffffffff - lVar32,lVar13) != SBORROW8(lVar40,uVar26)) ==
                       (long)(lVar40 - uVar26) < 0);
      if (lVar32 < 0) {
        piVar21 = piVar34;
      }
      if ((char)piVar21 != '\0') {
        bVar42 = CARRY8(uVar29,uVar6);
        uVar29 = uVar29 + uVar6;
        piVar27 = (int64_t *)((long)piVar27 + (ulong)bVar42 + lVar17);
        bVar42 = CARRY8(uVar11,uVar3);
        uVar11 = uVar11 + uVar3;
        lVar13 = lVar13 + lVar32 + (ulong)bVar42;
        goto LAB_00147192;
      }
      goto LAB_001476d3;
    }
LAB_00147192:
    a_02 = (int64_t *)0x8000000000000000;
    psVar23 = (secp256k1_modinv64_signed62 *)0x7fffffffffffffff;
    uVar26 = (long)piVar27 << 2 | uVar29 >> 0x3e;
    uVar3 = uStack_1e0 * lStack_1a8 + uVar26;
    piVar27 = (int64_t *)
              (((long)piVar27 >> 0x3e) + SUB168(SEXT816((long)uStack_1e0) * SEXT816(lStack_1a8),8) +
              (ulong)CARRY8(uStack_1e0 * lStack_1a8,uVar26));
    uVar6 = (long)piStack_1d8 * (long)psStack_190;
    lVar17 = SUB168(SEXT816((long)piStack_1d8) * SEXT816((long)psStack_190),8);
    uVar26 = (ulong)(-uVar6 - 1 < uVar3);
    lVar40 = (0x7fffffffffffffff - lVar17) - (long)piVar27;
    lVar32 = (-0x8000000000000000 - lVar17) - (ulong)(uVar6 != 0);
    lVar16 = (long)piVar27 - lVar32;
    piStack_1b8[1] = uVar29 & 0x3fffffffffffffff;
    a_01[1] = uVar11 & 0x3fffffffffffffff;
    bVar42 = (SBORROW8((long)piVar27,lVar32) != SBORROW8(lVar16,(ulong)(uVar3 < -uVar6))) ==
             (long)(lVar16 - (ulong)(uVar3 < -uVar6)) < 0;
    piVar21 = (int64_t *)(ulong)bVar42;
    bVar43 = (SBORROW8(0x7fffffffffffffff - lVar17,(long)piVar27) != SBORROW8(lVar40,uVar26)) ==
             (long)(lVar40 - uVar26) < 0;
    if (lVar17 < 0) {
      bVar43 = bVar42;
    }
    psVar12 = psStack_190;
    if (!bVar43) goto LAB_00147688;
    uVar11 = uVar11 >> 0x3e | lVar13 << 2;
    uVar15 = uVar3 + uVar6;
    piVar27 = (int64_t *)((long)piVar27 + (ulong)CARRY8(uVar3,uVar6) + lVar17);
    uVar6 = uStack_1f0 * lStack_1a8 + uVar11;
    lVar16 = SUB168(SEXT816((long)uStack_1f0) * SEXT816(lStack_1a8),8) + (lVar13 >> 0x3e) +
             (ulong)CARRY8(uStack_1f0 * lStack_1a8,uVar11);
    uVar26 = (long)piStack_1e8 * (long)psStack_190;
    lVar13 = SUB168(SEXT816((long)piStack_1e8) * SEXT816((long)psStack_190),8);
    uVar11 = (ulong)(-uVar26 - 1 < uVar6);
    lVar40 = (0x7fffffffffffffff - lVar13) - lVar16;
    psVar23 = (secp256k1_modinv64_signed62 *)(lVar40 - uVar11);
    psVar12 = (secp256k1_modinv64_signed62 *)0x8000000000000000;
    a_02 = (int64_t *)((-0x8000000000000000 - lVar13) - (ulong)(uVar26 != 0));
    bVar42 = (SBORROW8(0x7fffffffffffffff - lVar13,lVar16) != SBORROW8(lVar40,uVar11)) ==
             (long)psVar23 < 0;
    if (lVar13 < 0) {
      bVar42 = (SBORROW8(lVar16,(long)a_02) !=
               SBORROW8(lVar16 - (long)a_02,(ulong)(uVar6 < -uVar26))) ==
               (long)((lVar16 - (long)a_02) - (ulong)(uVar6 < -uVar26)) < 0;
    }
    piVar21 = (int64_t *)(ulong)bVar42;
    if (bVar42 == false) goto LAB_0014768d;
    uVar11 = uVar6 + uVar26;
    lVar13 = lVar16 + lVar13 + (ulong)CARRY8(uVar6,uVar26);
    lVar40 = psVar10->v[3];
    if (lVar40 == 0) {
LAB_00147375:
      a_02 = (int64_t *)0x8000000000000000;
      uVar26 = (long)piVar27 << 2 | uVar15 >> 0x3e;
      uVar3 = uStack_1e0 * (long)psStack_198 + uVar26;
      piVar27 = (int64_t *)
                (((long)piVar27 >> 0x3e) +
                 SUB168(SEXT816((long)uStack_1e0) * SEXT816((long)psStack_198),8) +
                (ulong)CARRY8(uStack_1e0 * (long)psStack_198,uVar26));
      uVar6 = (long)piStack_1d8 * (long)psStack_1a0;
      lVar17 = SUB168(SEXT816((long)piStack_1d8) * SEXT816((long)psStack_1a0),8);
      uVar26 = (ulong)(-uVar6 - 1 < uVar3);
      lVar40 = (0x7fffffffffffffff - lVar17) - (long)piVar27;
      lVar32 = (-0x8000000000000000 - lVar17) - (ulong)(uVar6 != 0);
      lVar16 = (long)piVar27 - lVar32;
      piStack_1b8[2] = uVar15 & 0x3fffffffffffffff;
      a_01[2] = uVar11 & 0x3fffffffffffffff;
      bVar42 = (SBORROW8((long)piVar27,lVar32) != SBORROW8(lVar16,(ulong)(uVar3 < -uVar6))) ==
               (long)(lVar16 - (ulong)(uVar3 < -uVar6)) < 0;
      piVar21 = (int64_t *)(ulong)bVar42;
      bVar43 = (SBORROW8(0x7fffffffffffffff - lVar17,(long)piVar27) != SBORROW8(lVar40,uVar26)) ==
               (long)(lVar40 - uVar26) < 0;
      if (lVar17 < 0) {
        bVar43 = bVar42;
      }
      psVar12 = psStack_1a0;
      psVar23 = psStack_198;
      if (!bVar43) goto LAB_00147692;
      uVar11 = uVar11 >> 0x3e | lVar13 << 2;
      uVar15 = uVar3 + uVar6;
      piVar27 = (int64_t *)((long)piVar27 + (ulong)CARRY8(uVar3,uVar6) + lVar17);
      uVar6 = uStack_1f0 * (long)psStack_198 + uVar11;
      lVar17 = SUB168(SEXT816((long)uStack_1f0) * SEXT816((long)psStack_198),8) + (lVar13 >> 0x3e) +
               (ulong)CARRY8(uStack_1f0 * (long)psStack_198,uVar11);
      uVar26 = (long)piStack_1e8 * (long)psStack_1a0;
      lVar16 = SUB168(SEXT816((long)piStack_1e8) * SEXT816((long)psStack_1a0),8);
      uVar11 = (ulong)(-uVar26 - 1 < uVar6);
      lVar40 = (0x7fffffffffffffff - lVar16) - lVar17;
      lVar32 = (-0x8000000000000000 - lVar16) - (ulong)(uVar26 != 0);
      lVar13 = lVar17 - lVar32;
      bVar42 = (SBORROW8(0x7fffffffffffffff - lVar16,lVar17) != SBORROW8(lVar40,uVar11)) ==
               (long)(lVar40 - uVar11) < 0;
      if (lVar16 < 0) {
        bVar42 = (SBORROW8(lVar17,lVar32) != SBORROW8(lVar13,(ulong)(uVar6 < -uVar26))) ==
                 (long)(lVar13 - (ulong)(uVar6 < -uVar26)) < 0;
      }
      piVar21 = (int64_t *)(ulong)bVar42;
      if (bVar42 == false) goto LAB_00147697;
      uVar3 = uVar6 + uVar26;
      lVar16 = lVar17 + lVar16 + (ulong)CARRY8(uVar6,uVar26);
      lVar40 = psVar10->v[4];
      uVar26 = lVar40 * lStack_1c8;
      piVar21 = SUB168(SEXT816(lVar40) * SEXT816(lStack_1c8),8);
      uVar11 = (ulong)(-uVar26 - 1 < uVar15);
      lVar13 = (0x7fffffffffffffff - (long)piVar21) - (long)piVar27;
      piVar41 = (int64_t *)((-0x8000000000000000 - (long)piVar21) - (ulong)(uVar26 != 0));
      bVar42 = (SBORROW8(0x7fffffffffffffff - (long)piVar21,(long)piVar27) !=
               SBORROW8(lVar13,uVar11)) == (long)(lVar13 - uVar11) < 0;
      if ((long)piVar21 < 0) {
        bVar42 = (SBORROW8((long)piVar27,(long)piVar41) !=
                 SBORROW8((long)piVar27 - (long)piVar41,(ulong)(uVar15 < -uVar26))) ==
                 (long)(((long)piVar27 - (long)piVar41) - (ulong)(uVar15 < -uVar26)) < 0;
      }
      if (!bVar42) goto LAB_0014769c;
      uVar6 = lVar40 * (long)psVar22;
      lVar13 = SUB168(SEXT816(lVar40) * SEXT816((long)psVar22),8);
      psVar23 = (secp256k1_modinv64_signed62 *)0x8000000000000000;
      uVar11 = (ulong)(-uVar6 - 1 < uVar3);
      lVar40 = (0x7fffffffffffffff - lVar13) - lVar16;
      a_02 = (int64_t *)((-0x8000000000000000 - lVar13) - (ulong)(uVar6 != 0));
      bVar42 = (SBORROW8(0x7fffffffffffffff - lVar13,lVar16) != SBORROW8(lVar40,uVar11)) ==
               (long)(lVar40 - uVar11) < 0;
      if (lVar13 < 0) {
        bVar42 = (SBORROW8(lVar16,(long)a_02) !=
                 SBORROW8(lVar16 - (long)a_02,(ulong)(uVar3 < -uVar6))) ==
                 (long)((lVar16 - (long)a_02) - (ulong)(uVar3 < -uVar6)) < 0;
      }
      psVar12 = (secp256k1_modinv64_signed62 *)(ulong)bVar42;
      if (bVar42 == false) goto LAB_001476a1;
      lVar17 = (long)piVar21 + (long)piVar27 + (ulong)CARRY8(uVar26,uVar15);
      lVar40 = lVar13 + lVar16 + (ulong)CARRY8(uVar6,uVar3);
      psVar12 = (secp256k1_modinv64_signed62 *)(lVar17 * 4 | uVar26 + uVar15 >> 0x3e);
      piStack_1b8[3] = uVar26 + uVar15 & 0x3fffffffffffffff;
      a_01[3] = uVar6 + uVar3 & 0x3fffffffffffffff;
      piVar27 = psVar12[0x333333333333332].v + 4;
      piVar21 = (int64_t *)
                ((lVar17 >> 0x3e) + -1 +
                (ulong)((secp256k1_modinv64_signed62 *)0x7fffffffffffffff < psVar12));
      if (piVar21 != (int64_t *)0xffffffffffffffff) goto LAB_001476a6;
      piVar21 = (int64_t *)0xffffffffffffffff;
      uVar11 = uVar6 + uVar3 >> 0x3e | lVar40 * 4;
      piStack_1b8[4] = (int64_t)psVar12;
      psVar23 = (secp256k1_modinv64_signed62 *)(uVar11 + 0x8000000000000000);
      if ((lVar40 >> 0x3e) + -1 + (ulong)(0x7fffffffffffffff < uVar11) != -1) goto LAB_001476ab;
      a_01[4] = uVar11;
      piVar21 = (int64_t *)0x5;
      psVar12 = (secp256k1_modinv64_signed62 *)0xfffffffffffffffe;
      piStack_1f8 = (int64_t *)0x1475c5;
      piVar27 = piStack_1b8;
      iVar1 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)piStack_1b8,5,psVar10,-2)
      ;
      if (iVar1 < 1) goto LAB_001476b0;
      psVar12 = (secp256k1_modinv64_signed62 *)0x1;
      piVar21 = (int64_t *)0x5;
      piStack_1f8 = (int64_t *)0x1475e2;
      piVar27 = piVar39;
      iVar1 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)piVar39,5,psVar10,1);
      if (-1 < iVar1) goto LAB_001476b5;
      piVar21 = (int64_t *)0x5;
      psVar12 = (secp256k1_modinv64_signed62 *)0xfffffffffffffffe;
      piStack_1f8 = (int64_t *)0x147601;
      piVar27 = a_01;
      iVar1 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)a_01,5,psVar10,-2);
      if (iVar1 < 1) goto LAB_001476ba;
      psVar12 = (secp256k1_modinv64_signed62 *)0x1;
      piVar21 = (int64_t *)0x5;
      piStack_1f8 = (int64_t *)0x14761e;
      piVar27 = a_01;
      iVar1 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)a_01,5,psVar10,1);
      if (iVar1 < 0) {
        return;
      }
      goto LAB_001476bf;
    }
    psVar23 = (secp256k1_modinv64_signed62 *)(lVar40 * lStack_1c8);
    lVar17 = SUB168(SEXT816(lVar40) * SEXT816(lStack_1c8),8);
    uVar26 = (ulong)(-(long)psVar23 - 1U < uVar15);
    lVar16 = (0x7fffffffffffffff - lVar17) - (long)piVar27;
    a_02 = (int64_t *)0x8000000000000000;
    piVar21 = (int64_t *)
              ((-0x8000000000000000 - lVar17) -
              (ulong)(psVar23 != (secp256k1_modinv64_signed62 *)0x0));
    bVar42 = (SBORROW8(0x7fffffffffffffff - lVar17,(long)piVar27) != SBORROW8(lVar16,uVar26)) ==
             (long)(lVar16 - uVar26) < 0;
    if (lVar17 < 0) {
      bVar42 = (SBORROW8((long)piVar27,(long)piVar21) !=
               SBORROW8((long)piVar27 - (long)piVar21,(ulong)(uVar15 < (ulong)-(long)psVar23))) ==
               (long)(((long)piVar27 - (long)piVar21) - (ulong)(uVar15 < (ulong)-(long)psVar23)) < 0
      ;
    }
    piVar34 = piStack_1b8;
    if (!bVar42) goto LAB_001476d8;
    uVar6 = lVar40 * (long)psVar22;
    lVar32 = SUB168(SEXT816(lVar40) * SEXT816((long)psVar22),8);
    uVar26 = (ulong)(-uVar6 - 1 < uVar11);
    lVar40 = (0x7fffffffffffffff - lVar32) - lVar13;
    lVar38 = (-0x8000000000000000 - lVar32) - (ulong)(uVar6 != 0);
    lVar16 = lVar13 - lVar38;
    piVar34 = (int64_t *)(lVar16 - (ulong)(uVar11 < -uVar6));
    bVar42 = (SBORROW8(0x7fffffffffffffff - lVar32,lVar13) != SBORROW8(lVar40,uVar26)) ==
             (long)(lVar40 - uVar26) < 0;
    if (lVar32 < 0) {
      bVar42 = (SBORROW8(lVar13,lVar38) != SBORROW8(lVar16,(ulong)(uVar11 < -uVar6))) ==
               (long)piVar34 < 0;
    }
    uVar14 = (uint)bVar42;
    if (bVar42 != false) {
      bVar42 = CARRY8(uVar15,(ulong)psVar23);
      uVar15 = (long)psVar23->v + uVar15;
      piVar27 = (int64_t *)((long)piVar27 + (ulong)bVar42 + lVar17);
      bVar42 = CARRY8(uVar11,uVar6);
      uVar11 = uVar11 + uVar6;
      lVar13 = lVar13 + lVar32 + (ulong)bVar42;
      goto LAB_00147375;
    }
  }
  piStack_1f8 = (int64_t *)secp256k1_modinv64_mul_cmp_62;
  secp256k1_modinv64_update_de_62_cold_18();
  psVar12 = &sStack_258;
  psStack_208 = psVar23;
  piStack_200 = a_02;
  piStack_1f8 = piVar34;
  secp256k1_modinv64_mul_62(&sStack_230,(secp256k1_modinv64_signed62 *)piVar27,uVar14,1);
  psVar10 = a_00;
  secp256k1_modinv64_mul_62(&sStack_258,a_00,5,(int64_t)psVar22);
  lVar40 = 0;
  while ((ulong)sStack_230.v[lVar40] < 0x4000000000000000) {
    if (0x3fffffffffffffff < (ulong)sStack_258.v[lVar40]) goto LAB_00147772;
    lVar40 = lVar40 + 1;
    if (lVar40 == 4) {
      uVar14 = 4;
      while( true ) {
        if (sStack_230.v[uVar14] < sStack_258.v[uVar14]) {
          return;
        }
        if (sStack_258.v[uVar14] < sStack_230.v[uVar14]) break;
        bVar42 = uVar14 == 0;
        uVar14 = uVar14 - 1;
        if (bVar42) {
          return;
        }
      }
      return;
    }
  }
  secp256k1_modinv64_mul_cmp_62_cold_2();
LAB_00147772:
  secp256k1_modinv64_mul_cmp_62_cold_1();
  iVar1 = (int)psVar12;
  if (iVar1 < 1) {
LAB_00147a31:
    secp256k1_modinv64_update_fg_62_var_cold_9();
LAB_00147a36:
    secp256k1_modinv64_update_fg_62_var_cold_1();
LAB_00147a3b:
    secp256k1_modinv64_update_fg_62_var_cold_2();
LAB_00147a40:
    secp256k1_modinv64_update_fg_62_var_cold_3();
LAB_00147a45:
    secp256k1_modinv64_update_fg_62_var_cold_4();
LAB_00147a4a:
    secp256k1_modinv64_update_fg_62_var_cold_8();
  }
  else {
    lVar40 = psVar22->v[0];
    lVar13 = psVar22->v[1];
    lVar16 = psVar10->v[0];
    lVar17 = *extraout_RDX_00;
    uVar11 = lVar16 * lVar40;
    lVar38 = SUB168(SEXT816(lVar16) * SEXT816(lVar40),8);
    uVar26 = lVar17 * lVar13;
    lVar18 = SUB168(SEXT816(lVar17) * SEXT816(lVar13),8);
    lVar32 = (0x7fffffffffffffff - lVar18) - lVar38;
    if (-1 < lVar18 &&
        (SBORROW8(0x7fffffffffffffff - lVar18,lVar38) != SBORROW8(lVar32,(ulong)(~uVar26 < uVar11)))
        != (long)(lVar32 - (ulong)(~uVar26 < uVar11)) < 0) goto LAB_00147a36;
    lVar32 = psVar22->v[2];
    lVar30 = lVar18 + lVar38 + (ulong)CARRY8(uVar26,uVar11);
    lVar38 = psVar22->v[3];
    uVar3 = lVar16 * lVar32;
    lVar18 = SUB168(SEXT816(lVar16) * SEXT816(lVar32),8);
    uVar15 = lVar17 * lVar38;
    lVar17 = SUB168(SEXT816(lVar17) * SEXT816(lVar38),8);
    uVar6 = (ulong)(-uVar15 - 1 < uVar3);
    lVar16 = (0x7fffffffffffffff - lVar17) - lVar18;
    if (-1 < lVar17 &&
        (SBORROW8(0x7fffffffffffffff - lVar17,lVar18) != SBORROW8(lVar16,uVar6)) !=
        (long)(lVar16 - uVar6) < 0) goto LAB_00147a3b;
    lVar16 = lVar17 + lVar18 + (ulong)CARRY8(uVar15,uVar3);
    if ((uVar26 + uVar11 & 0x3fffffffffffffff) != 0) goto LAB_00147a40;
    if ((uVar15 + uVar3 & 0x3fffffffffffffff) != 0) goto LAB_00147a45;
    uVar6 = uVar15 + uVar3 >> 0x3e | lVar16 * 4;
    uVar11 = uVar26 + uVar11 >> 0x3e | lVar30 * 4;
    lVar16 = lVar16 >> 0x3e;
    lVar30 = lVar30 >> 0x3e;
    if (iVar1 != 1) {
      psVar22 = (secp256k1_modinv64_signed62 *)((ulong)psVar12 & 0xffffffff);
      psVar12 = (secp256k1_modinv64_signed62 *)0x1;
      do {
        lVar17 = psVar10->v[(long)psVar12];
        uVar3 = lVar17 * lVar40 + uVar11;
        lVar24 = SUB168(SEXT816(lVar17) * SEXT816(lVar40),8) + lVar30 +
                 (ulong)CARRY8(lVar17 * lVar40,uVar11);
        lVar18 = extraout_RDX_00[(long)psVar12];
        uVar26 = lVar18 * lVar13;
        lVar19 = SUB168(SEXT816(lVar18) * SEXT816(lVar13),8);
        uVar11 = (ulong)(-uVar26 - 1 < uVar3);
        lVar30 = (0x7fffffffffffffff - lVar19) - lVar24;
        psVar23 = (secp256k1_modinv64_signed62 *)0x8000000000000000;
        lVar35 = (-0x8000000000000000 - lVar19) - (ulong)(uVar26 != 0);
        lVar36 = lVar24 - lVar35;
        bVar42 = (SBORROW8(0x7fffffffffffffff - lVar19,lVar24) != SBORROW8(lVar30,uVar11)) ==
                 (long)(lVar30 - uVar11) < 0;
        if (lVar19 < 0) {
          bVar42 = (SBORROW8(lVar24,lVar35) != SBORROW8(lVar36,(ulong)(uVar3 < -uVar26))) ==
                   (long)(lVar36 - (ulong)(uVar3 < -uVar26)) < 0;
        }
        if (!bVar42) {
          secp256k1_modinv64_update_fg_62_var_cold_5();
LAB_00147a2c:
          psVar10 = psVar23;
          secp256k1_modinv64_update_fg_62_var_cold_6();
          goto LAB_00147a31;
        }
        uVar29 = lVar17 * lVar32 + uVar6;
        lVar36 = SUB168(SEXT816(lVar17) * SEXT816(lVar32),8) + lVar16 +
                 (ulong)CARRY8(lVar17 * lVar32,uVar6);
        uVar15 = lVar18 * lVar38;
        lVar18 = SUB168(SEXT816(lVar18) * SEXT816(lVar38),8);
        uVar11 = (ulong)(-uVar15 - 1 < uVar29);
        lVar16 = (0x7fffffffffffffff - lVar18) - lVar36;
        lVar30 = (-0x8000000000000000 - lVar18) - (ulong)(uVar15 != 0);
        lVar17 = lVar36 - lVar30;
        bVar42 = (SBORROW8(0x7fffffffffffffff - lVar18,lVar36) != SBORROW8(lVar16,uVar11)) ==
                 (long)(lVar16 - uVar11) < 0;
        if (lVar18 < 0) {
          bVar42 = (SBORROW8(lVar36,lVar30) != SBORROW8(lVar17,(ulong)(uVar29 < -uVar15))) ==
                   (long)(lVar17 - (ulong)(uVar29 < -uVar15)) < 0;
        }
        if (!bVar42) goto LAB_00147a2c;
        lVar30 = lVar19 + lVar24 + (ulong)CARRY8(uVar26,uVar3);
        lVar16 = lVar18 + lVar36 + (ulong)CARRY8(uVar15,uVar29);
        uVar11 = lVar30 * 4 | uVar26 + uVar3 >> 0x3e;
        psVar10->v[(long)((long)psVar12[-1].v + 0x27)] = uVar26 + uVar3 & 0x3fffffffffffffff;
        uVar6 = lVar16 * 4 | uVar15 + uVar29 >> 0x3e;
        extraout_RDX_00[(long)((long)psVar12[-1].v + 0x27)] = uVar15 + uVar29 & 0x3fffffffffffffff;
        psVar12 = (secp256k1_modinv64_signed62 *)((long)psVar12->v + 1);
        lVar16 = lVar16 >> 0x3e;
        lVar30 = lVar30 >> 0x3e;
      } while (psVar22 != psVar12);
    }
    if (lVar30 + -1 + (ulong)(0x7fffffffffffffff < uVar11) != -1) goto LAB_00147a4a;
    psVar10->v[(long)iVar1 + -1] = uVar11;
    if (lVar16 + -1 + (ulong)(0x7fffffffffffffff < uVar6) == -1) {
      extraout_RDX_00[(long)iVar1 + -1] = uVar6;
      return;
    }
  }
  secp256k1_modinv64_update_fg_62_var_cold_7();
  lVar40 = psVar12->v[0];
  lVar13 = psVar12->v[1];
  lVar16 = psVar12->v[2];
  lVar17 = psVar12->v[3];
  lVar32 = psVar12->v[4];
  lVar38 = 0;
  do {
    if (psVar12->v[lVar38] < -0x3fffffffffffffff) {
      secp256k1_modinv64_normalize_62_cold_7();
LAB_00147c80:
      secp256k1_modinv64_normalize_62_cold_6();
      goto LAB_00147c85;
    }
    if (0x3fffffffffffffff < psVar12->v[lVar38]) goto LAB_00147c80;
    lVar38 = lVar38 + 1;
  } while (lVar38 != 5);
  iVar1 = secp256k1_modinv64_mul_cmp_62(psVar12,5,b,-2);
  if (iVar1 < 1) {
LAB_00147c85:
    secp256k1_modinv64_normalize_62_cold_5();
LAB_00147c8a:
    secp256k1_modinv64_normalize_62_cold_4();
LAB_00147c8f:
    secp256k1_modinv64_normalize_62_cold_3();
  }
  else {
    iVar1 = secp256k1_modinv64_mul_cmp_62(psVar12,5,b,1);
    if (-1 < iVar1) goto LAB_00147c8a;
    uVar11 = lVar32 >> 0x3f;
    uVar3 = (long)psVar10 >> 0x3f;
    uVar26 = ((uVar11 & b->v[0]) + lVar40 ^ uVar3) - uVar3;
    uVar15 = ((long)uVar26 >> 0x3e) + (((uVar11 & b->v[1]) + lVar13 ^ uVar3) - uVar3);
    uVar29 = ((long)uVar15 >> 0x3e) + ((lVar16 + (uVar11 & b->v[2]) ^ uVar3) - uVar3);
    uVar6 = ((long)uVar29 >> 0x3e) + (((uVar11 & b->v[3]) + lVar17 ^ uVar3) - uVar3);
    lVar40 = ((long)uVar6 >> 0x3e) + (((uVar11 & b->v[4]) + lVar32 ^ uVar3) - uVar3);
    uVar3 = lVar40 >> 0x3f;
    uVar11 = (b->v[0] & uVar3) + (uVar26 & 0x3fffffffffffffff);
    uVar15 = ((long)uVar11 >> 0x3e) + (b->v[1] & uVar3) + (uVar15 & 0x3fffffffffffffff);
    uVar26 = ((long)uVar15 >> 0x3e) + (b->v[2] & uVar3) + (uVar29 & 0x3fffffffffffffff);
    uVar6 = ((long)uVar26 >> 0x3e) + (b->v[3] & uVar3) + (uVar6 & 0x3fffffffffffffff);
    uVar3 = (b->v[4] & uVar3) + lVar40 + ((long)uVar6 >> 0x3e);
    psVar12->v[0] = uVar11 & 0x3fffffffffffffff;
    psVar12->v[1] = uVar15 & 0x3fffffffffffffff;
    psVar12->v[2] = uVar26 & 0x3fffffffffffffff;
    psVar12->v[3] = uVar6 & 0x3fffffffffffffff;
    psVar12->v[4] = uVar3;
    if (0x3fffffffffffffff < uVar3) goto LAB_00147c8f;
    iVar1 = secp256k1_modinv64_mul_cmp_62(psVar12,5,b,0);
    if (-1 < iVar1) {
      iVar1 = secp256k1_modinv64_mul_cmp_62(psVar12,5,b,1);
      if (iVar1 < 0) {
        return;
      }
      goto LAB_00147c99;
    }
  }
  secp256k1_modinv64_normalize_62_cold_2();
LAB_00147c99:
  secp256k1_modinv64_normalize_62_cold_1();
  return;
}

Assistant:

static void secp256k1_scalar_to_signed62(secp256k1_modinv64_signed62 *r, const secp256k1_scalar *a) {
    const uint64_t M62 = UINT64_MAX >> 2;
    const uint64_t a0 = a->d[0], a1 = a->d[1], a2 = a->d[2], a3 = a->d[3];

#ifdef VERIFY
    VERIFY_CHECK(secp256k1_scalar_check_overflow(a) == 0);
#endif

    r->v[0] =  a0                   & M62;
    r->v[1] = (a0 >> 62 | a1 <<  2) & M62;
    r->v[2] = (a1 >> 60 | a2 <<  4) & M62;
    r->v[3] = (a2 >> 58 | a3 <<  6) & M62;
    r->v[4] =  a3 >> 56;
}